

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.h
# Opt level: O2

void __thiscall
jsonnet::internal::Token::Token
          (Token *this,Kind kind,Fodder *fodder,string *data,string *string_block_indent,
          string *string_block_term_indent,LocationRange *location)

{
  this->kind = kind;
  std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
  vector(&this->fodder,fodder);
  std::__cxx11::string::string((string *)&this->data,(string *)data);
  std::__cxx11::string::string((string *)&this->stringBlockIndent,(string *)string_block_indent);
  std::__cxx11::string::string
            ((string *)&this->stringBlockTermIndent,(string *)string_block_term_indent);
  LocationRange::LocationRange(&this->location,location);
  return;
}

Assistant:

Token(Kind kind, const Fodder &fodder, const std::string &data,
          const std::string &string_block_indent, const std::string &string_block_term_indent,
          const LocationRange &location)
        : kind(kind),
          fodder(fodder),
          data(data),
          stringBlockIndent(string_block_indent),
          stringBlockTermIndent(string_block_term_indent),
          location(location)
    {
    }